

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

char ctemplate_htmlparser::jsparser_buffer_pop(jsparser_ctx *js)

{
  int iVar1;
  
  iVar1 = js->buffer_end;
  if (js->buffer_start == iVar1) {
    return '\0';
  }
  iVar1 = (-(uint)(0 < iVar1) | 0x11) + iVar1;
  js->buffer_end = iVar1;
  return js->buffer[iVar1];
}

Assistant:

char jsparser_buffer_pop(jsparser_ctx *js)
{
  if (js->buffer_start == js->buffer_end) {
    return '\0';
  }

  js->buffer_end--;
  if (js->buffer_end < 0) {
    js->buffer_end += JSPARSER_RING_BUFFER_SIZE;
  }

  return js->buffer[js->buffer_end];
}